

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlChar * xmlSchemaGetComponentQName(xmlChar **buf,void *item)

{
  int iVar1;
  uint uVar2;
  xmlChar *pxVar3;
  int *piVar4;
  long lVar5;
  char *add;
  
  add = (char *)0x0;
  piVar4 = (int *)item;
  do {
    if (piVar4 == (int *)0x0) break;
    iVar1 = *piVar4;
    if (iVar1 != 0x1a) {
      switch(iVar1) {
      case 1:
        add = "http://www.w3.org/2001/XMLSchema";
      case 2:
      case 3:
      case 6:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x13:
      case 0x14:
      case 0x15:
        break;
      case 4:
      case 5:
        add = *(char **)(piVar4 + 0x34);
        break;
      case 0xe:
        add = *(char **)(piVar4 + 0x18);
        break;
      case 0xf:
        add = *(char **)(piVar4 + 0x1c);
        break;
      case 0x10:
        add = *(char **)(piVar4 + 0x1a);
        break;
      case 0x11:
      case 0x16:
      case 0x17:
      case 0x18:
        add = *(char **)(piVar4 + 10);
        break;
      case 0x12:
        goto switchD_00192aa5_caseD_12;
      default:
        add = (char *)(xmlChar *)0x0;
        if (iVar1 != 2000) break;
switchD_00192aa5_caseD_12:
        add = *(char **)(piVar4 + 8);
      }
      break;
    }
    piVar4 = *(int **)(piVar4 + 6);
  } while (piVar4 != (int *)0x0);
  do {
    if ((uint *)item == (uint *)0x0) {
code_r0x0018c4df:
      if (*buf != (xmlChar *)0x0) {
        (*xmlFree)(*buf);
        *buf = (xmlChar *)0x0;
      }
      if ((xmlChar *)add == (xmlChar *)0x0) {
        pxVar3 = (xmlChar *)0x0;
      }
      else {
        pxVar3 = xmlStrdup((xmlChar *)"{");
        *buf = pxVar3;
        pxVar3 = xmlStrcat(pxVar3,(xmlChar *)add);
        *buf = pxVar3;
        pxVar3 = xmlStrcat(pxVar3,"}");
        *buf = pxVar3;
      }
      pxVar3 = xmlStrcat(pxVar3,(xmlChar *)"(NULL)");
      *buf = pxVar3;
      return pxVar3;
    }
    uVar2 = *item;
    if (uVar2 != 0x1a) {
      if (uVar2 < 0x19) {
        if ((0x1c032U >> (uVar2 & 0x1f) & 1) != 0) {
          lVar5 = 0x10;
          goto LAB_00192b46;
        }
        if ((0x1c20000U >> (uVar2 & 0x1f) & 1) != 0) {
          lVar5 = 0x20;
          goto LAB_00192b46;
        }
        if (uVar2 == 0x12) {
          lVar5 = 8;
          goto LAB_00192b46;
        }
      }
      if (uVar2 == 2000) {
        lVar5 = 0x18;
LAB_00192b46:
        pxVar3 = xmlSchemaFormatQName(buf,(xmlChar *)add,*(xmlChar **)((long)item + lVar5));
        return pxVar3;
      }
      goto code_r0x0018c4df;
    }
    item = *(void **)((long)item + 0x18);
    if ((uint *)item == (uint *)0x0) {
      pxVar3 = xmlSchemaFormatQName(buf,(xmlChar *)add,(xmlChar *)0x0);
      return pxVar3;
    }
  } while( true );
}

Assistant:

static const xmlChar*
xmlSchemaGetComponentQName(xmlChar **buf,
			   void *item)
{
    return (xmlSchemaFormatQName(buf,
	xmlSchemaGetComponentTargetNs((xmlSchemaBasicItemPtr) item),
	xmlSchemaGetComponentName((xmlSchemaBasicItemPtr) item)));
}